

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_putv(comex_giov_t *iov,int iov_len,int proc,comex_group_t group)

{
  int iVar1;
  int bytes;
  void **ppvVar2;
  void **ppvVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < iov_len) {
    uVar4 = 0;
    do {
      iVar1 = iov[uVar4].count;
      if (0 < (long)iVar1) {
        ppvVar2 = iov[uVar4].src;
        ppvVar3 = iov[uVar4].dst;
        bytes = iov[uVar4].bytes;
        lVar5 = 0;
        do {
          comex_put(ppvVar2[lVar5],ppvVar3[lVar5],bytes,proc,group);
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)iov_len);
  }
  return 0;
}

Assistant:

int comex_putv(
        comex_giov_t *iov, int iov_len,
        int proc, comex_group_t group)
{
    int i;
    for (i=0; i<iov_len; ++i) {
        int j;
        void **src = iov[i].src;
        void **dst = iov[i].dst;
        int bytes = iov[i].bytes;
        int count = iov[i].count;
        for (j=0; j<count; ++j) {
            comex_put(src[j], dst[j], bytes, proc, group);
        }
    }
    return COMEX_SUCCESS;
}